

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_and_b(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = verify_miniscript_two_param_check(node,parent);
  if (iVar3 == 0) {
    uVar1 = node->child->type_properties;
    uVar2 = node->child->next->type_properties;
    uVar4 = uVar2 & uVar1;
    uVar5 = uVar2 | uVar1;
    uVar5 = -(uint)((uVar4 & 0x8000) == 0x8000) & uVar4 & 0x2000 |
            -(uint)((uVar5 & 0x100) == 0x100) & uVar5 & 0x200 |
            -(uint)((uVar2 & 8) == 8) & uVar1 & 1 |
            -(uint)((uVar1 & 0x100) == 0x100) & uVar2 & 0x400 |
            uVar1 & 0x400 | uVar5 & 0x8000 | uVar4 & 0x10900;
    node->type_properties = uVar5 | 0x21000;
    if ((((~uVar2 & 0xc000) == 0) || ((uVar1 & 0xc000) == 0xc000)) || ((uVar4 & 0x4000) != 0)) {
      node->type_properties = uVar5 | 0x25000;
    }
  }
  return iVar3;
}

Assistant:

static int verify_miniscript_and_b(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop, y_prop;
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret != WALLY_OK)
        return ret;

    x_prop = node->child->type_properties;
    y_prop = node->child->next->type_properties;
    node->type_properties = MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_X;
    node->type_properties |= x_prop & y_prop &
                             (MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_Z | MINISCRIPT_PROPERTY_M);
    node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_S;
    node->type_properties |= x_prop & MINISCRIPT_PROPERTY_N;
    if (y_prop & MINISCRIPT_TYPE_W)
        node->type_properties |= x_prop & MINISCRIPT_TYPE_B;
    if ((x_prop | y_prop) & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_O;
    if (x_prop & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= y_prop & MINISCRIPT_PROPERTY_N;
    if ((x_prop & y_prop) & MINISCRIPT_PROPERTY_S)
        node->type_properties |= x_prop & y_prop & MINISCRIPT_PROPERTY_E;
    if (((x_prop & y_prop) & MINISCRIPT_PROPERTY_F) ||
        !(~x_prop & (MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_F)) ||
        !(~y_prop & (MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_F)))
        node->type_properties |= MINISCRIPT_PROPERTY_F;

    return WALLY_OK;
}